

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  GeneratorOptions *options_00;
  bool bVar1;
  OutputMode OVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar6;
  LogMessage *pLVar7;
  size_type sVar8;
  const_reference ppFVar9;
  ulong uVar10;
  reference ppFVar11;
  GeneratorOptions *pGVar12;
  size_type sVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FieldDescriptor *pFVar14;
  string *filename_00;
  undefined4 extraout_var_03;
  Descriptor *desc_00;
  EnumDescriptor *file_00;
  undefined1 local_7f8 [8];
  Printer printer_4;
  LogMessage local_768;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_730;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  undefined1 local_6e8 [8];
  string filename_4;
  FileDescriptor *file_1;
  int i_3;
  int j_4;
  int local_6ac;
  undefined1 local_6a8 [4];
  int j_3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided_3;
  Printer printer_3;
  LogMessage local_5d0;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_598;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_3;
  string filename_3;
  undefined1 local_568 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided_2;
  Printer printer_2;
  LogMessage local_4a8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_470;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_2;
  string filename_2;
  EnumDescriptor *enumdesc;
  undefined1 local_430 [4];
  int j_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided_1;
  Printer printer_1;
  LogMessage local_370;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_338;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_1;
  string filename_1;
  Descriptor *desc;
  int j_1;
  FileDescriptor *file;
  undefined1 local_2e8 [4];
  int i_2;
  set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> allowed_set;
  undefined1 local_2b0 [4];
  int i_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  FieldDescriptor *extension;
  int j;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  Printer printer;
  LogMessage local_1c8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_190;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string filename;
  undefined1 local_100 [8];
  GeneratorOptions options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  option_pairs;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  Generator *this_local;
  
  option_pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  GeneratorOptions::GeneratorOptions((GeneratorOptions *)local_100);
  bVar1 = GeneratorOptions::ParseFromOptions
                    ((GeneratorOptions *)local_100,
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_50,
                     &(option_pairs.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
  if (!bVar1) {
    this_local._7_1_ = 0;
    filename.field_2._12_4_ = 1;
    goto LAB_003a0cd7;
  }
  OVar2 = GeneratorOptions::output_mode((GeneratorOptions *)local_100);
  if (OVar2 == kEverythingInOneFile) {
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "/");
    std::operator+(&local_148,&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &options.add_require_for_enums);
    GeneratorOptions::GetFileNameExtension_abi_cxx11_
              ((string *)&output,(GeneratorOptions *)local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    iVar3 = (*context->_vptr_GeneratorContext[2])(context,local_128);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
              (&local_190,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3));
    printer.annotation_collector_._7_1_ = 0;
    pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_190);
    if (pZVar6 == (ZeroCopyOutputStream *)0x0) {
      internal::LogMessage::LogMessage
                (&local_1c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                 ,0xd30);
      printer.annotation_collector_._7_1_ = 1;
      pLVar7 = internal::LogMessage::operator<<(&local_1c8,"CHECK failed: output.get(): ");
      internal::LogFinisher::operator=
                ((LogFinisher *)((long)&printer.annotation_collector_ + 6),pLVar7);
    }
    if ((printer.annotation_collector_._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_1c8);
    }
    pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_190);
    io::Printer::Printer
              ((Printer *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pZVar6,'$');
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&j);
    for (extension._4_4_ = 0;
        sVar8 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(files), (ulong)(long)extension._4_4_ < sVar8;
        extension._4_4_ = extension._4_4_ + 1) {
      extension._0_4_ = 0;
      while( true ) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::operator[](files,(long)extension._4_4_);
        iVar3 = FileDescriptor::extension_count(*ppFVar9);
        if (iVar3 <= (int)extension) break;
        ppFVar9 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::operator[](files,(long)extension._4_4_);
        provided._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)FileDescriptor::extension(*ppFVar9,(int)extension);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&j,(value_type *)&provided._M_t._M_impl.super__Rb_tree_header._M_node_count);
        extension._0_4_ = (int)extension + 1;
      }
    }
    GenerateHeader(this,(GeneratorOptions *)local_100,
                   (Printer *)
                   &extensions.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_2b0);
    FindProvides(this,(GeneratorOptions *)local_100,
                 (Printer *)
                 &extensions.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,files,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b0);
    FindProvidesForFields
              (this,(GeneratorOptions *)local_100,
               (Printer *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&j,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b0);
    GenerateProvides(this,(GeneratorOptions *)local_100,
                     (Printer *)
                     &extensions.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b0);
    GenerateTestOnly(this,(GeneratorOptions *)local_100,
                     (Printer *)
                     &extensions.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    GenerateRequiresForLibrary
              (this,(GeneratorOptions *)local_100,
               (Printer *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,files,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b0);
    GenerateFilesInDepOrder
              (this,(GeneratorOptions *)local_100,
               (Printer *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,files);
    for (allowed_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        uVar10 = (ulong)allowed_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
        sVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)&j), uVar10 < sVar8;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             allowed_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      ppFVar11 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               *)&j,(long)allowed_set._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count._4_4_);
      bVar1 = anon_unknown_0::ShouldGenerateExtension(*ppFVar11);
      if (bVar1) {
        ppFVar11 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 *)&j,(long)allowed_set._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count._4_4_);
        GenerateExtension(this,(GeneratorOptions *)local_100,
                          (Printer *)
                          &extensions.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppFVar11);
      }
    }
    filename.field_2._M_local_buf[0xc] =
         io::Printer::failed((Printer *)
                             &extensions.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bool)filename.field_2._M_local_buf[0xc]) {
      this_local._7_1_ = 0;
    }
    filename.field_2._13_3_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2b0);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&j);
    io::Printer::~Printer
              ((Printer *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_190);
    std::__cxx11::string::~string((string *)local_128);
joined_r0x003a0981:
    if (filename.field_2._12_4_ != 0) goto LAB_003a0cd7;
  }
  else {
    OVar2 = GeneratorOptions::output_mode((GeneratorOptions *)local_100);
    if (OVar2 == kOneOutputFilePerType) {
      std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::set
                ((set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> *)
                 local_2e8);
      bVar1 = anon_unknown_0::GenerateJspbAllowedSet
                        ((GeneratorOptions *)local_100,files,
                         (set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                          *)local_2e8,
                         &(option_pairs.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      if (bVar1) {
        for (file._4_4_ = 0;
            sVar8 = std::
                    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::size(files), (ulong)(long)file._4_4_ < sVar8; file._4_4_ = file._4_4_ + 1) {
          ppFVar9 = std::
                    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::operator[](files,(long)file._4_4_);
          options_00 = (GeneratorOptions *)*ppFVar9;
          desc._4_4_ = 0;
          while( true ) {
            uVar4 = FileDescriptor::message_type_count((FileDescriptor *)options_00);
            desc_00 = (Descriptor *)(ulong)uVar4;
            if ((int)uVar4 <= desc._4_4_) break;
            pGVar12 = (GeneratorOptions *)
                      FileDescriptor::message_type((FileDescriptor *)options_00,desc._4_4_);
            filename_1.field_2._8_8_ = pGVar12;
            sVar13 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     ::count((set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                              *)local_2e8,(key_type *)((long)&filename_1.field_2 + 8));
            if (sVar13 != 0) {
              (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                        ((string *)&output_1,(_anonymous_namespace_ *)local_100,pGVar12,desc_00);
              iVar3 = (*context->_vptr_GeneratorContext[2])(context,&output_1);
              internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                        (&local_338,(ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3));
              printer_1.annotation_collector_._7_1_ = 0;
              pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                                 (&local_338);
              if (pZVar6 == (ZeroCopyOutputStream *)0x0) {
                internal::LogMessage::LogMessage
                          (&local_370,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                           ,0xd62);
                printer_1.annotation_collector_._7_1_ = 1;
                pLVar7 = internal::LogMessage::operator<<(&local_370,"CHECK failed: output.get(): ")
                ;
                internal::LogFinisher::operator=
                          ((LogFinisher *)((long)&printer_1.annotation_collector_ + 6),pLVar7);
              }
              if ((printer_1.annotation_collector_._7_1_ & 1) != 0) {
                internal::LogMessage::~LogMessage(&local_370);
              }
              pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                                 (&local_338);
              io::Printer::Printer
                        ((Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         pZVar6,'$');
              GenerateHeader(this,(GeneratorOptions *)local_100,
                             (Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_430);
              FindProvidesForMessage
                        (this,(GeneratorOptions *)local_100,
                         (Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (Descriptor *)pGVar12,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_430);
              GenerateProvides(this,(GeneratorOptions *)local_100,
                               (Printer *)
                               &provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_430);
              GenerateTestOnly(this,(GeneratorOptions *)local_100,
                               (Printer *)
                               &provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
              GenerateRequiresForMessage
                        (this,(GeneratorOptions *)local_100,
                         (Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (Descriptor *)pGVar12,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_430);
              GenerateClass(this,(GeneratorOptions *)local_100,
                            (Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (Descriptor *)pGVar12);
              filename.field_2._M_local_buf[0xc] =
                   io::Printer::failed((Printer *)
                                       &provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count)
              ;
              if ((bool)filename.field_2._M_local_buf[0xc]) {
                this_local._7_1_ = 0;
              }
              filename.field_2._13_3_ = 0;
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_430);
              io::Printer::~Printer
                        ((Printer *)&provided_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
              internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
                        (&local_338);
              std::__cxx11::string::~string((string *)&output_1);
              if (filename.field_2._12_4_ != 0) goto LAB_003a096d;
            }
            desc._4_4_ = desc._4_4_ + 1;
          }
          enumdesc._4_4_ = 0;
          while( true ) {
            uVar4 = FileDescriptor::enum_type_count((FileDescriptor *)options_00);
            file_00 = (EnumDescriptor *)(ulong)uVar4;
            if ((int)uVar4 <= enumdesc._4_4_) break;
            pGVar12 = (GeneratorOptions *)
                      FileDescriptor::enum_type((FileDescriptor *)options_00,enumdesc._4_4_);
            filename_2.field_2._8_8_ = pGVar12;
            sVar13 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     ::count((set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                              *)local_2e8,(key_type *)((long)&filename_2.field_2 + 8));
            if (sVar13 != 0) {
              (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                        ((string *)&output_2,(_anonymous_namespace_ *)local_100,pGVar12,file_00);
              iVar3 = (*context->_vptr_GeneratorContext[2])(context,&output_2);
              internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                        (&local_470,(ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar3));
              printer_2.annotation_collector_._7_1_ = 0;
              pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                                 (&local_470);
              if (pZVar6 == (ZeroCopyOutputStream *)0x0) {
                internal::LogMessage::LogMessage
                          (&local_4a8,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                           ,0xd7c);
                printer_2.annotation_collector_._7_1_ = 1;
                pLVar7 = internal::LogMessage::operator<<(&local_4a8,"CHECK failed: output.get(): ")
                ;
                internal::LogFinisher::operator=
                          ((LogFinisher *)((long)&printer_2.annotation_collector_ + 6),pLVar7);
              }
              if ((printer_2.annotation_collector_._7_1_ & 1) != 0) {
                internal::LogMessage::~LogMessage(&local_4a8);
              }
              pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                                 (&local_470);
              io::Printer::Printer
                        ((Printer *)&provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         pZVar6,'$');
              GenerateHeader(this,(GeneratorOptions *)local_100,
                             (Printer *)&provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_568);
              FindProvidesForEnum(this,(GeneratorOptions *)local_100,
                                  (Printer *)
                                  &provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (EnumDescriptor *)pGVar12,
                                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_568);
              GenerateProvides(this,(GeneratorOptions *)local_100,
                               (Printer *)
                               &provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_568);
              GenerateTestOnly(this,(GeneratorOptions *)local_100,
                               (Printer *)
                               &provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
              GenerateEnum(this,(GeneratorOptions *)local_100,
                           (Printer *)&provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (EnumDescriptor *)pGVar12);
              filename.field_2._M_local_buf[0xc] =
                   io::Printer::failed((Printer *)
                                       &provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count)
              ;
              if ((bool)filename.field_2._M_local_buf[0xc]) {
                this_local._7_1_ = 0;
              }
              filename.field_2._13_3_ = 0;
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_568);
              io::Printer::~Printer
                        ((Printer *)&provided_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
              internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
                        (&local_470);
              std::__cxx11::string::~string((string *)&output_2);
              if (filename.field_2._12_4_ != 0) goto LAB_003a096d;
            }
            enumdesc._4_4_ = enumdesc._4_4_ + 1;
          }
          filename_3.field_2._8_8_ = options_00;
          sVar13 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::
                   count((set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                          *)local_2e8,(key_type *)((long)&filename_3.field_2 + 8));
          if (sVar13 == 1) {
            (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                      ((string *)&output_3,(_anonymous_namespace_ *)local_100,options_00,
                       (FileDescriptor *)file_00);
            iVar3 = (*context->_vptr_GeneratorContext[2])(context,&output_3);
            internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                      (&local_598,(ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar3));
            printer_3.annotation_collector_._7_1_ = 0;
            pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                               (&local_598);
            if (pZVar6 == (ZeroCopyOutputStream *)0x0) {
              internal::LogMessage::LogMessage
                        (&local_5d0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0xd93);
              printer_3.annotation_collector_._7_1_ = 1;
              pLVar7 = internal::LogMessage::operator<<(&local_5d0,"CHECK failed: output.get(): ");
              internal::LogFinisher::operator=
                        ((LogFinisher *)((long)&printer_3.annotation_collector_ + 6),pLVar7);
            }
            if ((printer_3.annotation_collector_._7_1_ & 1) != 0) {
              internal::LogMessage::~LogMessage(&local_5d0);
            }
            pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                               (&local_598);
            io::Printer::Printer
                      ((Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       pZVar6,'$');
            GenerateHeader(this,(GeneratorOptions *)local_100,
                           (Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_6a8);
            local_6ac = 0;
            while( true ) {
              iVar3 = local_6ac;
              ppFVar9 = std::
                        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ::operator[](files,(long)file._4_4_);
              iVar5 = FileDescriptor::extension_count(*ppFVar9);
              if (iVar5 <= iVar3) break;
              ppFVar9 = std::
                        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ::operator[](files,(long)file._4_4_);
              pFVar14 = FileDescriptor::extension(*ppFVar9,local_6ac);
              bVar1 = anon_unknown_0::ShouldGenerateExtension(pFVar14);
              if (bVar1) {
                ppFVar9 = std::
                          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ::operator[](files,(long)file._4_4_);
                _i_3 = FileDescriptor::extension(*ppFVar9,local_6ac);
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_6a8,(value_type *)&i_3);
              }
              local_6ac = local_6ac + 1;
            }
            FindProvidesForFields
                      (this,(GeneratorOptions *)local_100,
                       (Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_6a8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            GenerateProvides(this,(GeneratorOptions *)local_100,
                             (Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&fields.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            GenerateTestOnly(this,(GeneratorOptions *)local_100,
                             (Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
            GenerateRequiresForExtensions
                      (this,(GeneratorOptions *)local_100,
                       (Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_6a8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            file_1._4_4_ = 0;
            while( true ) {
              ppFVar9 = std::
                        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ::operator[](files,(long)file._4_4_);
              iVar3 = FileDescriptor::extension_count(*ppFVar9);
              if (iVar3 <= file_1._4_4_) break;
              ppFVar9 = std::
                        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ::operator[](files,(long)file._4_4_);
              pFVar14 = FileDescriptor::extension(*ppFVar9,file_1._4_4_);
              bVar1 = anon_unknown_0::ShouldGenerateExtension(pFVar14);
              if (bVar1) {
                ppFVar9 = std::
                          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ::operator[](files,(long)file._4_4_);
                pFVar14 = FileDescriptor::extension(*ppFVar9,file_1._4_4_);
                GenerateExtension(this,(GeneratorOptions *)local_100,
                                  (Printer *)
                                  &provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  pFVar14);
              }
              file_1._4_4_ = file_1._4_4_ + 1;
            }
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_6a8);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            io::Printer::~Printer
                      ((Printer *)&provided_3._M_t._M_impl.super__Rb_tree_header._M_node_count);
            internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
                      (&local_598);
            std::__cxx11::string::~string((string *)&output_3);
          }
        }
        filename.field_2._12_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        filename.field_2._12_4_ = 1;
      }
LAB_003a096d:
      std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::~set
                ((set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> *)
                 local_2e8);
      goto joined_r0x003a0981;
    }
    for (file_1._0_4_ = 0;
        sVar8 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(files), (ulong)(long)(int)file_1 < sVar8; file_1._0_4_ = (int)file_1 + 1) {
      ppFVar9 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](files,(long)(int)file_1);
      filename_4.field_2._8_8_ = *ppFVar9;
      std::operator+(&local_708,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     "/");
      filename_00 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)filename_4.field_2._8_8_);
      anon_unknown_0::GetJSFilename((string *)&output_4,(GeneratorOptions *)local_100,filename_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8,
                     &local_708,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_4)
      ;
      std::__cxx11::string::~string((string *)&output_4);
      std::__cxx11::string::~string((string *)&local_708);
      iVar3 = (*context->_vptr_GeneratorContext[2])(context,local_6e8);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_730,(ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar3));
      printer_4.annotation_collector_._7_1_ = 0;
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_730);
      if (pZVar6 == (ZeroCopyOutputStream *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_768,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                   ,0xdb6);
        printer_4.annotation_collector_._7_1_ = 1;
        pLVar7 = internal::LogMessage::operator<<(&local_768,"CHECK failed: output.get(): ");
        internal::LogFinisher::operator=
                  ((LogFinisher *)((long)&printer_4.annotation_collector_ + 6),pLVar7);
      }
      if ((printer_4.annotation_collector_._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_768);
      }
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_730);
      io::Printer::Printer((Printer *)local_7f8,pZVar6,'$');
      GenerateFile(this,(GeneratorOptions *)local_100,(Printer *)local_7f8,
                   (FileDescriptor *)filename_4.field_2._8_8_);
      filename.field_2._M_local_buf[0xc] = io::Printer::failed((Printer *)local_7f8);
      if ((bool)filename.field_2._M_local_buf[0xc]) {
        this_local._7_1_ = 0;
      }
      filename.field_2._13_3_ = 0;
      io::Printer::~Printer((Printer *)local_7f8);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_730);
      std::__cxx11::string::~string((string *)local_6e8);
      if (filename.field_2._12_4_ != 0) goto LAB_003a0cd7;
    }
  }
  this_local._7_1_ = 1;
  filename.field_2._12_4_ = 1;
LAB_003a0cd7:
  GeneratorOptions::~GeneratorOptions((GeneratorOptions *)local_100);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const string& parameter,
                            GeneratorContext* context,
                            string* error) const {
  std::vector< std::pair< string, string > > option_pairs;
  ParseGeneratorParameter(parameter, &option_pairs);
  GeneratorOptions options;
  if (!options.ParseFromOptions(option_pairs, error)) {
    return false;
  }


  if (options.output_mode() == GeneratorOptions::kEverythingInOneFile) {
    // All output should go in a single file.
    string filename = options.output_dir + "/" + options.library +
                      options.GetFileNameExtension();
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GOOGLE_CHECK(output.get());
    io::Printer printer(output.get(), '$');

    // Pull out all extensions -- we need these to generate all
    // provides/requires.
    std::vector<const FieldDescriptor*> extensions;
    for (int i = 0; i < files.size(); i++) {
      for (int j = 0; j < files[i]->extension_count(); j++) {
        const FieldDescriptor* extension = files[i]->extension(j);
        extensions.push_back(extension);
      }
    }

    GenerateHeader(options, &printer);

    std::set<string> provided;
    FindProvides(options, &printer, files, &provided);
    FindProvidesForFields(options, &printer, extensions, &provided);
    GenerateProvides(options, &printer, &provided);
    GenerateTestOnly(options, &printer);
    GenerateRequiresForLibrary(options, &printer, files, &provided);

    GenerateFilesInDepOrder(options, &printer, files);

    for (int i = 0; i < extensions.size(); i++) {
      if (ShouldGenerateExtension(extensions[i])) {
        GenerateExtension(options, &printer, extensions[i]);
      }
    }

    if (printer.failed()) {
      return false;
    }
  } else if (options.output_mode() == GeneratorOptions::kOneOutputFilePerType) {
    std::set<const void*> allowed_set;
    if (!GenerateJspbAllowedSet(options, files, &allowed_set, error)) {
      return false;
    }

    for (int i = 0; i < files.size(); i++) {
      const FileDescriptor* file = files[i];
      for (int j = 0; j < file->message_type_count(); j++) {
        const Descriptor* desc = file->message_type(j);
        if (allowed_set.count(desc) == 0) {
          continue;
        }

        string filename = GetMessageFileName(options, desc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForMessage(options, &printer, desc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForMessage(options, &printer, desc, &provided);

        GenerateClass(options, &printer, desc);

        if (printer.failed()) {
          return false;
        }
      }
      for (int j = 0; j < file->enum_type_count(); j++) {
        const EnumDescriptor* enumdesc = file->enum_type(j);
        if (allowed_set.count(enumdesc) == 0) {
          continue;
        }

        string filename = GetEnumFileName(options, enumdesc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForEnum(options, &printer, enumdesc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);

        GenerateEnum(options, &printer, enumdesc);

        if (printer.failed()) {
          return false;
        }
      }
      // File-level extensions (message-level extensions are generated under
      // the enclosing message).
      if (allowed_set.count(file) == 1) {
        string filename = GetExtensionFileName(options, file);

        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        std::vector<const FieldDescriptor*> fields;

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            fields.push_back(files[i]->extension(j));
          }
        }

        FindProvidesForFields(options, &printer, fields, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForExtensions(options, &printer, fields, &provided);

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            GenerateExtension(options, &printer, files[i]->extension(j));
          }
        }
      }
    }
  } else /* options.output_mode() == kOneOutputFilePerInputFile */ {
    // Generate one output file per input (.proto) file.

    for (int i = 0; i < files.size(); i++) {
      const google::protobuf::FileDescriptor* file = files[i];

      string filename =
          options.output_dir + "/" + GetJSFilename(options, file->name());
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
      GOOGLE_CHECK(output.get());
      io::Printer printer(output.get(), '$');

      GenerateFile(options, &printer, file);

      if (printer.failed()) {
        return false;
      }
    }
  }

  return true;
}